

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_logger_recorders.cpp
# Opt level: O0

unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_>
MakeStdErrLoaderLogRecorder(void *user_data)

{
  OstreamLoaderLogRecorder *this;
  void *in_RSI;
  void *user_data_local;
  unique_ptr<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>_> *recorder;
  
  this = (OstreamLoaderLogRecorder *)operator_new(0x38);
  anon_unknown.dwarf_5e6fc::OstreamLoaderLogRecorder::OstreamLoaderLogRecorder
            (this,(ostream *)&std::cerr,in_RSI,0x1000);
  std::unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>>::
  unique_ptr<std::default_delete<LoaderLogRecorder>,void>
            ((unique_ptr<LoaderLogRecorder,std::default_delete<LoaderLogRecorder>> *)user_data,
             (pointer)this);
  return (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         (__uniq_ptr_data<LoaderLogRecorder,_std::default_delete<LoaderLogRecorder>,_true,_true>)
         user_data;
}

Assistant:

std::unique_ptr<LoaderLogRecorder> MakeStdErrLoaderLogRecorder(void* user_data) {
    std::unique_ptr<LoaderLogRecorder> recorder(
        new OstreamLoaderLogRecorder(std::cerr, user_data, XR_LOADER_LOG_MESSAGE_SEVERITY_ERROR_BIT));
    return recorder;
}